

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_common.c
# Opt level: O3

void close_real_openal(void)

{
  void *pvVar1;
  
  pvVar1 = realdll;
  realdll = (void *)0x0;
  REAL_alcGetCurrentContext = (_func_ALCcontext_ptr *)0x0;
  REAL_alcGetContextsDevice = (_func_ALCdevice_ptr_ALCcontext_ptr *)0x0;
  REAL_alcIsExtensionPresent = (_func_ALCboolean_ALCdevice_ptr_ALCchar_ptr *)0x0;
  REAL_alcGetProcAddress = (_func_void_ptr_ALCdevice_ptr_ALCchar_ptr *)0x0;
  REAL_alcGetEnumValue = (_func_ALCenum_ALCdevice_ptr_ALCchar_ptr *)0x0;
  REAL_alcGetString = (_func_ALCchar_ptr_ALCdevice_ptr_ALCenum *)0x0;
  REAL_alcCaptureOpenDevice = (_func_ALCdevice_ptr_ALCchar_ptr_ALCuint_ALCenum_ALCsizei *)0x0;
  REAL_alcCaptureCloseDevice = (_func_ALCboolean_ALCdevice_ptr *)0x0;
  REAL_alcOpenDevice = (_func_ALCdevice_ptr_ALCchar_ptr *)0x0;
  REAL_alcCloseDevice = (_func_ALCboolean_ALCdevice_ptr *)0x0;
  REAL_alcCreateContext = (_func_ALCcontext_ptr_ALCdevice_ptr_ALCint_ptr *)0x0;
  REAL_alcMakeContextCurrent = (_func_ALCboolean_ALCcontext_ptr *)0x0;
  REAL_alcProcessContext = (_func_void_ALCcontext_ptr *)0x0;
  REAL_alcSuspendContext = (_func_void_ALCcontext_ptr *)0x0;
  REAL_alcDestroyContext = (_func_void_ALCcontext_ptr *)0x0;
  REAL_alcGetError = (_func_ALCenum_ALCdevice_ptr *)0x0;
  REAL_alcGetIntegerv = (_func_void_ALCdevice_ptr_ALCenum_ALCsizei_ALCint_ptr *)0x0;
  REAL_alcCaptureStart = (_func_void_ALCdevice_ptr *)0x0;
  REAL_alcCaptureStop = (_func_void_ALCdevice_ptr *)0x0;
  REAL_alcCaptureSamples = (_func_void_ALCdevice_ptr_ALCvoid_ptr_ALCsizei *)0x0;
  REAL_alDopplerFactor = (_func_void_ALfloat *)0x0;
  REAL_alDopplerVelocity = (_func_void_ALfloat *)0x0;
  REAL_alSpeedOfSound = (_func_void_ALfloat *)0x0;
  REAL_alDistanceModel = (_func_void_ALenum *)0x0;
  REAL_alEnable = (_func_void_ALenum *)0x0;
  REAL_alDisable = (_func_void_ALenum *)0x0;
  REAL_alIsEnabled = (_func_ALboolean_ALenum *)0x0;
  REAL_alGetString = (_func_ALchar_ptr_ALenum *)0x0;
  REAL_alGetBooleanv = (_func_void_ALenum_ALboolean_ptr *)0x0;
  REAL_alGetIntegerv = (_func_void_ALenum_ALint_ptr *)0x0;
  REAL_alGetFloatv = (_func_void_ALenum_ALfloat_ptr *)0x0;
  REAL_alGetDoublev = (_func_void_ALenum_ALdouble_ptr *)0x0;
  REAL_alGetBoolean = (_func_ALboolean_ALenum *)0x0;
  REAL_alGetInteger = (_func_ALint_ALenum *)0x0;
  REAL_alGetFloat = (_func_ALfloat_ALenum *)0x0;
  REAL_alGetDouble = (_func_ALdouble_ALenum *)0x0;
  REAL_alIsExtensionPresent = (_func_ALboolean_ALchar_ptr *)0x0;
  REAL_alGetError = (_func_ALenum *)0x0;
  REAL_alGetProcAddress = (_func_void_ptr_ALchar_ptr *)0x0;
  REAL_alGetEnumValue = (_func_ALenum_ALchar_ptr *)0x0;
  REAL_alListenerfv = (_func_void_ALenum_ALfloat_ptr *)0x0;
  REAL_alListenerf = (_func_void_ALenum_ALfloat *)0x0;
  REAL_alListener3f = (_func_void_ALenum_ALfloat_ALfloat_ALfloat *)0x0;
  REAL_alListeneriv = (_func_void_ALenum_ALint_ptr *)0x0;
  REAL_alListeneri = (_func_void_ALenum_ALint *)0x0;
  REAL_alListener3i = (_func_void_ALenum_ALint_ALint_ALint *)0x0;
  REAL_alGetListenerfv = (_func_void_ALenum_ALfloat_ptr *)0x0;
  REAL_alGetListenerf = (_func_void_ALenum_ALfloat_ptr *)0x0;
  REAL_alGetListener3f = (_func_void_ALenum_ALfloat_ptr_ALfloat_ptr_ALfloat_ptr *)0x0;
  REAL_alGetListeneri = (_func_void_ALenum_ALint_ptr *)0x0;
  REAL_alGetListeneriv = (_func_void_ALenum_ALint_ptr *)0x0;
  REAL_alGetListener3i = (_func_void_ALenum_ALint_ptr_ALint_ptr_ALint_ptr *)0x0;
  REAL_alGenSources = (_func_void_ALsizei_ALuint_ptr *)0x0;
  REAL_alDeleteSources = (_func_void_ALsizei_ALuint_ptr *)0x0;
  REAL_alIsSource = (_func_ALboolean_ALuint *)0x0;
  REAL_alSourcefv = (_func_void_ALuint_ALenum_ALfloat_ptr *)0x0;
  REAL_alSourcef = (_func_void_ALuint_ALenum_ALfloat *)0x0;
  REAL_alSource3f = (_func_void_ALuint_ALenum_ALfloat_ALfloat_ALfloat *)0x0;
  REAL_alSourceiv = (_func_void_ALuint_ALenum_ALint_ptr *)0x0;
  REAL_alSourcei = (_func_void_ALuint_ALenum_ALint *)0x0;
  REAL_alSource3i = (_func_void_ALuint_ALenum_ALint_ALint_ALint *)0x0;
  REAL_alGetSourcefv = (_func_void_ALuint_ALenum_ALfloat_ptr *)0x0;
  REAL_alGetSourcef = (_func_void_ALuint_ALenum_ALfloat_ptr *)0x0;
  REAL_alGetSource3f = (_func_void_ALuint_ALenum_ALfloat_ptr_ALfloat_ptr_ALfloat_ptr *)0x0;
  REAL_alGetSourceiv = (_func_void_ALuint_ALenum_ALint_ptr *)0x0;
  REAL_alGetSourcei = (_func_void_ALuint_ALenum_ALint_ptr *)0x0;
  REAL_alGetSource3i = (_func_void_ALuint_ALenum_ALint_ptr_ALint_ptr_ALint_ptr *)0x0;
  REAL_alSourcePlay = (_func_void_ALuint *)0x0;
  REAL_alSourcePlayv = (_func_void_ALsizei_ALuint_ptr *)0x0;
  REAL_alSourcePause = (_func_void_ALuint *)0x0;
  REAL_alSourcePausev = (_func_void_ALsizei_ALuint_ptr *)0x0;
  REAL_alSourceRewind = (_func_void_ALuint *)0x0;
  REAL_alSourceRewindv = (_func_void_ALsizei_ALuint_ptr *)0x0;
  REAL_alSourceStop = (_func_void_ALuint *)0x0;
  REAL_alSourceStopv = (_func_void_ALsizei_ALuint_ptr *)0x0;
  REAL_alSourceQueueBuffers = (_func_void_ALuint_ALsizei_ALuint_ptr *)0x0;
  REAL_alSourceUnqueueBuffers = (_func_void_ALuint_ALsizei_ALuint_ptr *)0x0;
  REAL_alGenBuffers = (_func_void_ALsizei_ALuint_ptr *)0x0;
  REAL_alDeleteBuffers = (_func_void_ALsizei_ALuint_ptr *)0x0;
  REAL_alIsBuffer = (_func_ALboolean_ALuint *)0x0;
  REAL_alBufferData = (_func_void_ALuint_ALenum_ALvoid_ptr_ALsizei_ALsizei *)0x0;
  REAL_alBufferfv = (_func_void_ALuint_ALenum_ALfloat_ptr *)0x0;
  REAL_alBufferf = (_func_void_ALuint_ALenum_ALfloat *)0x0;
  REAL_alBuffer3f = (_func_void_ALuint_ALenum_ALfloat_ALfloat_ALfloat *)0x0;
  REAL_alBufferiv = (_func_void_ALuint_ALenum_ALint_ptr *)0x0;
  REAL_alBufferi = (_func_void_ALuint_ALenum_ALint *)0x0;
  REAL_alBuffer3i = (_func_void_ALuint_ALenum_ALint_ALint_ALint *)0x0;
  REAL_alGetBufferfv = (_func_void_ALuint_ALenum_ALfloat_ptr *)0x0;
  REAL_alGetBufferf = (_func_void_ALuint_ALenum_ALfloat_ptr *)0x0;
  REAL_alGetBuffer3f = (_func_void_ALuint_ALenum_ALfloat_ptr_ALfloat_ptr_ALfloat_ptr *)0x0;
  REAL_alGetBufferi = (_func_void_ALuint_ALenum_ALint_ptr *)0x0;
  REAL_alGetBuffer3i = (_func_void_ALuint_ALenum_ALint_ptr_ALint_ptr_ALint_ptr *)0x0;
  REAL_alGetBufferiv = (_func_void_ALuint_ALenum_ALint_ptr *)0x0;
  REAL_alTracePushScope = (_func_void_ALchar_ptr *)0x0;
  REAL_alTracePopScope = (_func_void *)0x0;
  REAL_alTraceMessage = (_func_void_ALchar_ptr *)0x0;
  REAL_alTraceBufferLabel = (_func_void_ALuint_ALchar_ptr *)0x0;
  REAL_alTraceSourceLabel = (_func_void_ALuint_ALchar_ptr *)0x0;
  REAL_alcTraceDeviceLabel = (_func_void_ALCdevice_ptr_ALchar_ptr *)0x0;
  REAL_alcTraceContextLabel = (_func_void_ALCcontext_ptr_ALchar_ptr *)0x0;
  if (pvVar1 == (void *)0x0) {
    return;
  }
  dlclose();
  return;
}

Assistant:

void close_real_openal(void)
{
    void *dll = realdll;

    realdll = NULL;

    #define ENTRYPOINT(ret,name,params,args,numargs,visitparams,visitargs) REAL_##name = NULL;
    #include "altrace_entrypoints.h"

    if (dll) {
        dlclose(dll);
    }
}